

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service_base::
async_send<asio::const_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          const_buffers_1 *buffers,message_flags flags,
          function<void_(const_std::error_code_&,_unsigned_long)> *handler,any_io_executor *io_ex)

{
  bool bVar1;
  reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
  *prVar2;
  long in_RSI;
  base_implementation_type *in_RDI;
  enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_send_op<const_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::handler_type,_typename_reactive_socket_send_op<const_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
  *in_R8;
  undefined8 in_R9;
  ptr p;
  associated_cancellation_slot_t<std::function<void_(const_std::error_code_&,_unsigned_long)>_> slot
  ;
  bool is_continuation;
  function<void_(const_std::error_code_&,_unsigned_long)> *in_stack_ffffffffffffff28;
  function<void_(const_std::error_code_&,_unsigned_long)> *in_stack_ffffffffffffff30;
  const_buffers_1 *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
  *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff67;
  reactor_op_cancellation *in_stack_ffffffffffffff68;
  int op_type;
  reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
  *this_00;
  undefined4 in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffffa0;
  enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_send_op<const_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::handler_type,_typename_reactive_socket_send_op<const_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
  *peVar4;
  cancellation_slot local_40;
  undefined1 local_31;
  message_flags mStack_2c;
  enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_send_op<const_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::handler_type,_typename_reactive_socket_send_op<const_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
  *local_28;
  long local_10;
  
  mStack_2c = (message_flags)((ulong)in_R9 >> 0x20);
  local_28 = in_R8;
  local_10 = in_RSI;
  local_31 = asio_handler_cont_helpers::
             is_continuation<std::function<void(std::error_code_const&,unsigned_long)>>
                       ((function<void_(const_std::error_code_&,_unsigned_long)> *)0x6f9950);
  local_40.handler_ =
       (cancellation_handler_base **)
       get_associated_cancellation_slot<std::function<void(std::error_code_const&,unsigned_long)>>
                 (in_stack_ffffffffffffff28);
  prVar2 = reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
           ::ptr::allocate(in_stack_ffffffffffffff30);
  reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
  ::reactive_socket_send_op
            (in_stack_ffffffffffffff50,
             (error_code *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             (socket_type)((ulong)in_stack_ffffffffffffff40 >> 0x20),
             (state_type)((ulong)in_stack_ffffffffffffff40 >> 0x18),in_stack_ffffffffffffff38,
             mStack_2c,
             (function<void_(const_std::error_code_&,_unsigned_long)> *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
             (any_io_executor *)in_stack_ffffffffffffff68);
  this_00 = prVar2;
  bVar1 = cancellation_slot::is_connected(&local_40);
  peVar4 = local_28;
  if (bVar1) {
    in_stack_ffffffffffffff68 =
         cancellation_slot::
         emplace<asio::detail::reactive_socket_service_base::reactor_op_cancellation,asio::detail::epoll_reactor*,asio::detail::epoll_reactor::descriptor_state**,int&,asio::detail::epoll_reactor::op_types>
                   ((cancellation_slot *)CONCAT44(1,in_stack_ffffffffffffff80),
                    (epoll_reactor **)this_00,(descriptor_state ***)in_RDI,
                    (int *)in_stack_ffffffffffffff68,
                    (op_types *)
                    CONCAT17(in_stack_ffffffffffffff67,
                             CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)));
    (prVar2->super_reactive_socket_send_op_base<asio::const_buffers_1>).super_reactor_op.
    cancellation_key_ = in_stack_ffffffffffffff68;
    peVar4 = local_28;
  }
  op_type = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  bVar1 = false;
  uVar3 = local_31;
  if ((*(byte *)(local_10 + 4) & 0x10) != 0) {
    bVar1 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::all_empty
                      ((const_buffers_1 *)0x6f9ae5);
  }
  start_op<asio::detail::reactive_socket_send_op<asio::const_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>>
            ((reactive_socket_service_base *)this_00,in_RDI,op_type,
             (reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
              *)CONCAT17(bVar1,CONCAT16(uVar3,in_stack_ffffffffffffff60)),
             SUB81((ulong)prVar2 >> 0x38,0),SUB81((ulong)prVar2 >> 0x30,0),
             SUB81((ulong)prVar2 >> 0x28,0),SUB81((ulong)prVar2 >> 0x20,0),in_stack_ffffffffffffffa0
             ,peVar4);
  reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
  ::ptr::~ptr((ptr *)0x6f9b73);
  return;
}

Assistant:

void async_send(base_implementation_type& impl,
      const ConstBufferSequence& buffers, socket_base::message_flags flags,
      Handler& handler, const IoExecutor& io_ex)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    associated_cancellation_slot_t<Handler> slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_send_op<
        ConstBufferSequence, Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(success_ec_, impl.socket_,
        impl.state_, buffers, flags, handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<reactor_op_cancellation>(
            &reactor_, &impl.reactor_data_, impl.socket_, reactor::write_op);
    }

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_send"));

    start_op(impl, reactor::write_op, p.p, is_continuation, true,
        ((impl.state_ & socket_ops::stream_oriented)
          && buffer_sequence_adapter<asio::const_buffer,
            ConstBufferSequence>::all_empty(buffers)), true, &io_ex, 0);
    p.v = p.p = 0;
  }